

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  size_t __nbytes;
  bool bVar4;
  undefined1 local_98 [8];
  AddressBook address_book;
  string local_58 [8];
  string message;
  socklen_t local_38 [2];
  int addrlen;
  int opt;
  sockaddr_in address;
  int new_socket;
  int server_fd;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_38[1] = 1;
  local_38[0] = 0x10;
  address.sin_zero._4_4_ = socket(2,1,0);
  if (address.sin_zero._4_4_ == 0) {
    perror("socket failed");
    exit(1);
  }
  iVar2 = setsockopt(address.sin_zero._4_4_,1,0xf,local_38 + 1,4);
  if (iVar2 != 0) {
    perror("setsockopt");
    exit(1);
  }
  addrlen._0_2_ = 2;
  opt = 0;
  addrlen._2_2_ = htons(9999);
  iVar2 = bind(address.sin_zero._4_4_,(sockaddr *)&addrlen,0x10);
  if (iVar2 < 0) {
    perror("bind failed");
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"server start listening on ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,9999);
  std::operator<<(poVar3,"...\n");
  iVar2 = listen(address.sin_zero._4_4_,3);
  if (-1 < iVar2) {
    while( true ) {
      address.sin_zero._0_4_ = accept(address.sin_zero._4_4_,(sockaddr *)&addrlen,local_38);
      if (address.sin_zero._0_4_ == 0) {
        return 0;
      }
      if ((int)address.sin_zero._0_4_ < 0) break;
      std::__cxx11::string::string(local_58);
      read(address.sin_zero._0_4_,local_58,__nbytes);
      Messages::AddressBook::AddressBook((AddressBook *)local_98);
      bVar1 = google::protobuf::MessageLite::ParseFromString((string *)local_98);
      bVar4 = (bVar1 & 1) != 0;
      if (bVar4) {
        list_people((AddressBook *)local_98);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to parse address book.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -1;
      }
      Messages::AddressBook::~AddressBook((AddressBook *)local_98);
      std::__cxx11::string::~string(local_58);
      if (!bVar4) {
        return argv_local._4_4_;
      }
    }
    perror("accept");
    exit(1);
  }
  perror("listen");
  exit(1);
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	int server_fd, new_socket; 
	struct sockaddr_in address; 
	int opt = 1; 
	int addrlen = sizeof(address); 
	
	// Creating socket file descriptor 
	if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) 
	{ 
		perror("socket failed"); 
		exit(EXIT_FAILURE); 
	} 
	
	// Forcefully attaching socket to the port 8080 
	if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR | SO_REUSEPORT, 
												&opt, sizeof(opt))) 
	{ 
		perror("setsockopt"); 
		exit(EXIT_FAILURE); 
	} 
	address.sin_family = AF_INET; 
	address.sin_addr.s_addr = INADDR_ANY; 
	address.sin_port = htons( PORT ); 
	
	// Forcefully attaching socket to the port 8080 
	if (bind(server_fd, (struct sockaddr *)&address, 
								sizeof(address))<0) 
	{ 
		perror("bind failed"); 
		exit(EXIT_FAILURE); 
	} 
	cout << "server start listening on "<< PORT <<"...\n";
	if (listen(server_fd, 3) < 0) 
	{ 
		perror("listen"); 
		exit(EXIT_FAILURE); 
	} 
	while ((new_socket = accept(server_fd, (struct sockaddr *)&address, 
					(socklen_t*)&addrlen))) 
	{ 
		if(new_socket < 0) {
			perror("accept"); 
			exit(EXIT_FAILURE); 
		} else
		{
			string message;
			read(new_socket, message);
			Messages::AddressBook address_book;
			if (!address_book.ParseFromString(message)) {
				cerr << "Failed to parse address book." << endl;
				return -1;
			}
			list_people(address_book);
		}
	} 

	return 0; 
}